

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_float_convert.cpp
# Opt level: O2

void local_float_convert::get_random_digit_string<31ul,2ul>(string *str)

{
  result_type rVar1;
  int iVar2;
  result_type_conflict __n;
  reference pvVar3;
  ulong __n_00;
  
  if (get_random_digit_string<31ul,2ul>(std::__cxx11::string&)::dist_sgn == '\0') {
    iVar2 = __cxa_guard_acquire(&get_random_digit_string<31ul,2ul>(std::__cxx11::string&)::dist_sgn)
    ;
    if (iVar2 != 0) {
      get_random_digit_string<31UL,_2UL>::dist_sgn._M_param._M_a = 0;
      get_random_digit_string<31UL,_2UL>::dist_sgn._M_param._M_b = 1;
      __cxa_guard_release(&get_random_digit_string<31ul,2ul>(std::__cxx11::string&)::dist_sgn);
    }
  }
  if (get_random_digit_string<31ul,2ul>(std::__cxx11::string&)::dist_len == '\0') {
    iVar2 = __cxa_guard_acquire(&get_random_digit_string<31ul,2ul>(std::__cxx11::string&)::dist_len)
    ;
    if (iVar2 != 0) {
      get_random_digit_string<31UL,_2UL>::dist_len._M_param._M_a = 2;
      get_random_digit_string<31UL,_2UL>::dist_len._M_param._M_b = 0x1f;
      __cxa_guard_release(&get_random_digit_string<31ul,2ul>(std::__cxx11::string&)::dist_len);
    }
  }
  if (get_random_digit_string<31ul,2ul>(std::__cxx11::string&)::dist_first == '\0') {
    iVar2 = __cxa_guard_acquire(&get_random_digit_string<31ul,2ul>(std::__cxx11::string&)::
                                 dist_first);
    if (iVar2 != 0) {
      get_random_digit_string<31UL,_2UL>::dist_first._M_param._M_a = 1;
      get_random_digit_string<31UL,_2UL>::dist_first._M_param._M_b = 9;
      __cxa_guard_release(&get_random_digit_string<31ul,2ul>(std::__cxx11::string&)::dist_first);
    }
  }
  if (get_random_digit_string<31ul,2ul>(std::__cxx11::string&)::dist_following == '\0') {
    iVar2 = __cxa_guard_acquire(&get_random_digit_string<31ul,2ul>(std::__cxx11::string&)::
                                 dist_following);
    if (iVar2 != 0) {
      get_random_digit_string<31UL,_2UL>::dist_following._M_param._M_a = 0;
      get_random_digit_string<31UL,_2UL>::dist_following._M_param._M_b = 9;
      __cxa_guard_release(&get_random_digit_string<31ul,2ul>(std::__cxx11::string&)::dist_following)
      ;
    }
  }
  engine_sgn();
  rVar1 = std::uniform_int_distribution<unsigned_int>::operator()
                    (&get_random_digit_string<31UL,_2UL>::dist_sgn,&engine_sgn::my_engine_sgn);
  engine_e10();
  __n = std::uniform_int_distribution<unsigned_long>::operator()
                  (&get_random_digit_string<31UL,_2UL>::dist_len,&engine_e10::my_engine_e10);
  if (rVar1 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize(str,__n)
    ;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (str,__n + 1);
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       (str,0);
    *pvVar3 = '-';
  }
  __n_00 = (ulong)(rVar1 != 0);
  engine_man();
  rVar1 = std::uniform_int_distribution<unsigned_int>::operator()
                    (&get_random_digit_string<31UL,_2UL>::dist_first,&engine_man::my_engine_man);
  pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     (str,__n_00);
  *pvVar3 = (char)rVar1 + '0';
  while (__n_00 = __n_00 + 1, __n_00 < str->_M_string_length) {
    engine_man();
    rVar1 = std::uniform_int_distribution<unsigned_int>::operator()
                      (&get_random_digit_string<31UL,_2UL>::dist_following,
                       &engine_man::my_engine_man);
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       (str,__n_00);
    *pvVar3 = (char)rVar1 + '0';
  }
  return;
}

Assistant:

auto get_random_digit_string(std::string& str) -> void // NOLINT(google-runtime-references)
  {
    static_assert(MinDigitsToGet >=  2U, "Error: The minimum number of digits to get must be  2 or more");

    static auto dist_sgn = unsigned_dist_maker(static_cast<unsigned>(UINT8_C(0)),
                                               static_cast<unsigned>(UINT8_C(1)));

    static auto dist_len = unsigned_dist_maker(MinDigitsToGet, MaxDigitsToGet);

    static auto dist_first = unsigned_dist_maker(static_cast<unsigned>(UINT8_C(1)),
                                                 static_cast<unsigned>(UINT8_C(9)));

    static auto dist_following = unsigned_dist_maker(static_cast<unsigned>(UINT8_C(0)),
                                                     static_cast<unsigned>(UINT8_C(9)));

    const bool is_neg = (dist_sgn(engine_sgn()) != 0);

    const auto len = dist_len(engine_e10());

    auto pos = static_cast<std::string::size_type>(0U);

    if(is_neg)
    {
      str.resize(len + 1U);

      str.at(pos) = '-';

      ++pos;
    }
    else
    {
      str.resize(len);
    }

    str.at(pos) =
      static_cast<char>
      (
          dist_first(engine_man())
        + static_cast<std::uniform_int_distribution<unsigned>::result_type>(UINT32_C(0x30))
      );

    ++pos;

    while(pos < str.length())
    {
      str.at(pos) =
        static_cast<char>
        (
            dist_following(engine_man())
          + static_cast<std::uniform_int_distribution<unsigned>::result_type>(UINT32_C(0x30))
        );

      ++pos;
    }
  }